

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::LocalAccessChainConvertPass::ConvertLocalAccessChains
          (LocalAccessChainConvertPass *this,Function *func)

{
  pointer ppIVar1;
  pointer puVar2;
  Instruction *ip;
  Instruction *pIVar3;
  pointer puVar4;
  bool bVar5;
  uint32_t valId;
  Status SVar6;
  pointer puVar7;
  Instruction **ppIVar8;
  Instruction *pIVar9;
  DebugInfoManager *this_00;
  long lVar10;
  BasicBlock *pBVar11;
  Status local_a4;
  undefined1 local_a0 [8];
  Instruction *store;
  uint32_t varId_1;
  uint32_t varId;
  undefined8 uStack_80;
  code *local_78;
  code *local_70;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_instructions;
  iterator local_38;
  
  FindTargetVars(this,func);
  local_a4 = Failure;
  puVar4 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar7 = puVar4;
    puVar2 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 == puVar2) break;
    dead_instructions.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dead_instructions.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dead_instructions.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pBVar11 = (puVar7->_M_t).
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar8 = (Instruction **)
              ((long)&(pBVar11->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while( true ) {
      ip = *ppIVar8;
      pIVar3 = &(pBVar11->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
      local_a0 = (undefined1  [8])ip;
      if (ip == pIVar3) break;
      SVar6 = local_a4;
      if (ip->opcode_ == OpStore) {
        store = ip;
        pIVar9 = MemPass::GetPtr(&this->super_MemPass,ip,&varId_1);
        bVar5 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,pIVar9->opcode_);
        if ((bVar5) && (bVar5 = MemPass::IsTargetVar(&this->super_MemPass,varId_1), bVar5)) {
          _varId = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)0x0;
          uStack_80 = 0;
          local_78 = (code *)0x0;
          valId = Instruction::GetSingleWordInOperand(store,1);
          bVar5 = GenAccessChainStoreReplacement
                            (this,pIVar9,valId,
                             (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                              *)&varId);
          if (!bVar5) {
            std::
            vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                       *)&varId);
            goto LAB_004dbf6c;
          }
          lVar10 = (long)(uStack_80 - _varId) >> 3;
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          push_back(&dead_instructions,&store);
          local_a0 = (undefined1  [8])
                     ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_a0)->next_node_;
          InstructionList::iterator::InsertBefore
                    (&local_38,
                     (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                      *)local_a0);
          local_a0 = (undefined1  [8])local_38.super_iterator.node_;
          while( true ) {
            lVar10 = lVar10 + -1;
            Instruction::UpdateDebugInfoFrom((Instruction *)local_a0,store);
            this_00 = IRContext::get_debug_info_mgr((this->super_MemPass).super_Pass.context_);
            analysis::DebugInfoManager::AnalyzeDebugInst(this_00,(Instruction *)local_a0);
            if (lVar10 == 0) break;
            local_a0 = (undefined1  [8])
                       ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_a0)->next_node_;
          }
          std::
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     *)&varId);
          SVar6 = 1;
        }
      }
      else if (ip->opcode_ == OpLoad) {
        pIVar9 = MemPass::GetPtr(&this->super_MemPass,ip,
                                 (uint32_t *)((_Any_data *)&varId)->_M_pod_data);
        bVar5 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,pIVar9->opcode_);
        if (bVar5) {
          bVar5 = MemPass::IsTargetVar(&this->super_MemPass,varId);
          if (bVar5) {
            bVar5 = ReplaceAccessChainLoad(this,pIVar9,(Instruction *)local_a0);
            SVar6 = 1;
            if (!bVar5) goto LAB_004dbf6c;
          }
        }
      }
      local_a4 = SVar6;
      ppIVar8 = &((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_a0)->next_node_;
      pBVar11 = (puVar7->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    }
    while (dead_instructions.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           dead_instructions.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      ppIVar1 = dead_instructions.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      dead_instructions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           dead_instructions.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      uStack_80 = 0;
      _varId = &dead_instructions;
      local_70 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp:320:21)>
                 ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp:320:21)>
                 ::_M_manager;
      MemPass::DCEInst(&this->super_MemPass,*ppIVar1,
                       (function<void_(spvtools::opt::Instruction_*)> *)&varId);
      if (local_78 != (code *)0x0) {
        (*local_78)((_Any_data *)&varId,(_Any_data *)&varId,__destroy_functor);
      }
    }
LAB_004dbf6c:
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&dead_instructions.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
    puVar4 = puVar7 + 1;
  } while (ip == pIVar3);
  SVar6 = Failure;
  if (puVar7 == puVar2) {
    SVar6 = local_a4 ^ SuccessWithoutChange;
  }
  return SVar6;
}

Assistant:

Pass::Status LocalAccessChainConvertPass::ConvertLocalAccessChains(
    Function* func) {
  FindTargetVars(func);
  // Replace access chains of all targeted variables with equivalent
  // extract and insert sequences
  bool modified = false;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    std::vector<Instruction*> dead_instructions;
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      switch (ii->opcode()) {
        case spv::Op::OpLoad: {
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsNonPtrAccessChain(ptrInst->opcode())) break;
          if (!IsTargetVar(varId)) break;
          if (!ReplaceAccessChainLoad(ptrInst, &*ii)) {
            return Status::Failure;
          }
          modified = true;
        } break;
        case spv::Op::OpStore: {
          uint32_t varId;
          Instruction* store = &*ii;
          Instruction* ptrInst = GetPtr(store, &varId);
          if (!IsNonPtrAccessChain(ptrInst->opcode())) break;
          if (!IsTargetVar(varId)) break;
          std::vector<std::unique_ptr<Instruction>> newInsts;
          uint32_t valId = store->GetSingleWordInOperand(kStoreValIdInIdx);
          if (!GenAccessChainStoreReplacement(ptrInst, valId, &newInsts)) {
            return Status::Failure;
          }
          size_t num_of_instructions_to_skip = newInsts.size() - 1;
          dead_instructions.push_back(store);
          ++ii;
          ii = ii.InsertBefore(std::move(newInsts));
          for (size_t i = 0; i < num_of_instructions_to_skip; ++i) {
            ii->UpdateDebugInfoFrom(store);
            context()->get_debug_info_mgr()->AnalyzeDebugInst(&*ii);
            ++ii;
          }
          ii->UpdateDebugInfoFrom(store);
          context()->get_debug_info_mgr()->AnalyzeDebugInst(&*ii);
          modified = true;
        } break;
        default:
          break;
      }
    }

    while (!dead_instructions.empty()) {
      Instruction* inst = dead_instructions.back();
      dead_instructions.pop_back();
      DCEInst(inst, [&dead_instructions](Instruction* other_inst) {
        auto i = std::find(dead_instructions.begin(), dead_instructions.end(),
                           other_inst);
        if (i != dead_instructions.end()) {
          dead_instructions.erase(i);
        }
      });
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}